

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O2

size_t mfwrite(void *ptr,size_t size,size_t nmemb,mFILE *mf)

{
  char *pcVar1;
  size_t __size;
  size_t __n;
  ulong uVar2;
  bool bVar3;
  
  if ((mf->mode & 2U) == 0) {
LAB_0012c20e:
    nmemb = 0;
  }
  else {
    if ((mf->mode & 4U) != 0) {
      mf->offset = mf->size;
    }
    __n = size * nmemb;
    __size = mf->alloced;
    while (uVar2 = mf->offset, __size < uVar2 + __n) {
      bVar3 = __size == 0;
      __size = __size * 2;
      if (bVar3) {
        __size = 0x400;
      }
      pcVar1 = (char *)realloc(mf->data,__size);
      if (pcVar1 == (char *)0x0) goto LAB_0012c20e;
      mf->alloced = __size;
      mf->data = pcVar1;
    }
    if (uVar2 < mf->flush_pos) {
      mf->flush_pos = uVar2;
    }
    memcpy(mf->data + uVar2,ptr,__n);
    uVar2 = __n + mf->offset;
    mf->offset = uVar2;
    if (mf->size < uVar2) {
      mf->size = uVar2;
    }
  }
  return nmemb;
}

Assistant:

size_t mfwrite(void *ptr, size_t size, size_t nmemb, mFILE *mf) {
    if (!(mf->mode & MF_WRITE))
	return 0;

    /* Append mode => forced all writes to end of file */
    if (mf->mode & MF_APPEND)
	mf->offset = mf->size;

    /* Make sure we have enough room */
    while (size * nmemb + mf->offset > mf->alloced) {
	size_t new_alloced = mf->alloced ? mf->alloced * 2 : 1024;
	void * new_data = realloc(mf->data, new_alloced);
	if (NULL == new_data) return 0;
	mf->alloced = new_alloced;
	mf->data    = new_data;
    }

    /* Record where we need to reflush from */
    if (mf->offset < mf->flush_pos)
	mf->flush_pos = mf->offset;

    /* Copy the data over */
    memcpy(&mf->data[mf->offset], ptr, size * nmemb);
    mf->offset += size * nmemb;
    if (mf->size < mf->offset)
	mf->size = mf->offset;

    return nmemb;
}